

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::OperatorAddFun::GetFunctions(void)

{
  bool bVar1;
  ScalarFunction *in_RDI;
  LogicalType *in_stack_00000b20;
  LogicalType *in_stack_00000b28;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *add;
  ScalarFunction *this;
  LogicalTypeId in_stack_ffffffffffffe7ef;
  LogicalType *in_stack_ffffffffffffe7f0;
  string *in_stack_ffffffffffffe808;
  ScalarFunctionSet *in_stack_ffffffffffffe810;
  LogicalType *in_stack_ffffffffffffea48;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"+",&local_31);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogicalType::Numeric();
  local_50 = local_68;
  local_70._M_current =
       (LogicalType *)
       ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)this,(__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                     *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator*(&local_70);
    duckdb::AddFunction::GetFunction(in_stack_ffffffffffffea48);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
    ScalarFunction::~ScalarFunction(this);
    duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
    ScalarFunction::~ScalarFunction(this);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(&local_70);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124c55c);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c73b);
  LogicalType::~LogicalType((LogicalType *)0x124c748);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c7bc);
  LogicalType::~LogicalType((LogicalType *)0x124c7c9);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c83d);
  LogicalType::~LogicalType((LogicalType *)0x124c84a);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c8be);
  LogicalType::~LogicalType((LogicalType *)0x124c8cb);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c93f);
  LogicalType::~LogicalType((LogicalType *)0x124c94c);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124c9c0);
  LogicalType::~LogicalType((LogicalType *)0x124c9cd);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124ca41);
  LogicalType::~LogicalType((LogicalType *)0x124ca4e);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cac2);
  LogicalType::~LogicalType((LogicalType *)0x124cacf);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cb43);
  LogicalType::~LogicalType((LogicalType *)0x124cb50);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cbc4);
  LogicalType::~LogicalType((LogicalType *)0x124cbd1);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cc45);
  LogicalType::~LogicalType((LogicalType *)0x124cc52);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124ccc6);
  LogicalType::~LogicalType((LogicalType *)0x124ccd3);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cd47);
  LogicalType::~LogicalType((LogicalType *)0x124cd54);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124cdc8);
  LogicalType::~LogicalType((LogicalType *)0x124cdd5);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  LogicalType::LogicalType(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7ef);
  duckdb::AddFunction::GetFunction(in_stack_00000b28,in_stack_00000b20);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x124ce49);
  LogicalType::~LogicalType((LogicalType *)0x124ce56);
  ListConcatFun::GetFunction();
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  return (ScalarFunctionSet *)this;
}

Assistant:

ScalarFunctionSet OperatorAddFun::GetFunctions() {
	ScalarFunctionSet add("+");
	for (auto &type : LogicalType::Numeric()) {
		// unary add function is a nop, but only exists for numeric types
		add.AddFunction(AddFunction::GetFunction(type));
		// binary add function adds two numbers together
		add.AddFunction(AddFunction::GetFunction(type, type));
	}
	// we can add integers to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTEGER, LogicalType::DATE));
	// we can add intervals together
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can add intervals to dates/times/timestamps
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::DATE));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIMESTAMP));

	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	add.AddFunction(AddFunction::GetFunction(LogicalType::INTERVAL, LogicalType::TIME_TZ));

	// we can add times to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME));

	// we can add times with time zones (offsets) to dates
	add.AddFunction(AddFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::DATE));
	add.AddFunction(AddFunction::GetFunction(LogicalType::DATE, LogicalType::TIME_TZ));

	// we can add lists together
	add.AddFunction(ListConcatFun::GetFunction());

	return add;
}